

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_mesh.cpp
# Opt level: O2

Reals __thiscall Omega_h::Mesh::ask_qualities(Mesh *this)

{
  bool bVar1;
  Int IVar2;
  uint uVar3;
  void *extraout_RDX;
  Mesh *in_RSI;
  Reals RVar4;
  allocator local_59;
  Reals qualities;
  string local_48;
  Write<double> local_28;
  
  IVar2 = dim(in_RSI);
  std::__cxx11::string::string((string *)&local_48,"quality",(allocator *)&qualities);
  bVar1 = has_tag(in_RSI,IVar2,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  if (!bVar1) {
    measure_qualities((Omega_h *)&qualities,in_RSI);
    IVar2 = dim(in_RSI);
    std::__cxx11::string::string((string *)&local_48,"quality",&local_59);
    Write<double>::Write(&local_28,&qualities.write_);
    add_tag<double>(in_RSI,IVar2,&local_48,1,(Read<double> *)&local_28,false);
    Write<double>::~Write(&local_28);
    std::__cxx11::string::~string((string *)&local_48);
    Write<double>::~Write(&qualities.write_);
  }
  uVar3 = dim(in_RSI);
  std::__cxx11::string::string((string *)&local_48,"quality",(allocator *)&qualities);
  get_array<double>(this,(Int)in_RSI,(string *)(ulong)uVar3);
  std::__cxx11::string::~string((string *)&local_48);
  RVar4.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar4.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Reals)RVar4.write_.shared_alloc_;
}

Assistant:

Reals Mesh::ask_qualities() {
  if (!has_tag(dim(), "quality")) {
    auto qualities = measure_qualities(this);
    add_tag(dim(), "quality", 1, qualities);
  }
  return get_array<Real>(dim(), "quality");
}